

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Reader.cpp
# Opt level: O0

StepStatus __thiscall
adios2::core::engine::BP4Reader::BeginStep(BP4Reader *this,StepMode mode,float timeoutSeconds)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int in_ESI;
  BP4Reader *in_RDI;
  StepStatus status;
  ScopedTimer __var281;
  undefined4 in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc5c;
  undefined4 in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc64;
  unsigned_long in_stack_fffffffffffffc98;
  allocator *paVar4;
  undefined8 in_stack_fffffffffffffca0;
  int iVar5;
  string *in_stack_fffffffffffffca8;
  string *message;
  string *in_stack_fffffffffffffcb0;
  string *in_stack_fffffffffffffcb8;
  BP4Reader *in_stack_fffffffffffffcc0;
  Seconds in_stack_fffffffffffffcc8;
  string *in_stack_fffffffffffffcd0;
  string *in_stack_fffffffffffffce0;
  undefined8 in_stack_fffffffffffffce8;
  undefined1 zeroStart;
  undefined4 in_stack_fffffffffffffcf0;
  allocator local_2d1;
  string local_2d0 [32];
  duration<double,std::ratio<1l,1l>> local_2b0 [8];
  duration<double,std::ratio<1l,1l>> local_2a8 [7];
  undefined1 in_stack_fffffffffffffd5f;
  StepStatus SVar6;
  undefined4 in_stack_fffffffffffffd64;
  string local_298 [39];
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [39];
  undefined1 local_221 [40];
  undefined1 local_1f9 [40];
  undefined1 local_1d1 [40];
  undefined1 local_1a9 [40];
  undefined1 local_181 [40];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  undefined1 local_109 [40];
  allocator local_e1;
  string local_e0 [32];
  string local_c0 [39];
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [39];
  allocator local_49;
  string local_48 [56];
  float local_10;
  int local_c;
  
  iVar5 = (int)((ulong)in_stack_fffffffffffffca0 >> 0x20);
  local_c = in_ESI;
  if ((BeginStep(adios2::StepMode,float)::__var81 == '\0') &&
     (iVar2 = __cxa_guard_acquire(&BeginStep(adios2::StepMode,float)::__var81), iVar2 != 0)) {
    BeginStep::__var81 = (void *)ps_timer_create_("BP4Reader::BeginStep");
    __cxa_guard_release(&BeginStep(adios2::StepMode,float)::__var81);
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            ((ScopedTimer *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
             (void *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"Engine",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"BP4Reader",&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"BeginStep",&local_99);
  CurrentStep(in_RDI);
  std::__cxx11::to_string(in_stack_fffffffffffffc98);
  iVar3 = helper::Comm::Rank((Comm *)0xa18a36);
  iVar2 = in_RDI->m_Verbosity;
  helper::Log(in_stack_fffffffffffffcd0,(string *)in_stack_fffffffffffffcc8.__r,
              (string *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
              (int)((ulong)in_stack_fffffffffffffcb0 >> 0x20),(int)in_stack_fffffffffffffcb0,
              (int)in_stack_fffffffffffffce0,(int)in_stack_fffffffffffffce8,
              (LogMode)in_stack_fffffffffffffcf0);
  zeroStart = (undefined1)((ulong)in_stack_fffffffffffffce8 >> 0x38);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (local_c != 2) {
    paVar4 = &local_e1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,"Engine",paVar4);
    zeroStart = (undefined1)((ulong)paVar4 >> 0x38);
    in_stack_fffffffffffffce0 = (string *)local_109;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_109 + 1),"BP4Reader",(allocator *)in_stack_fffffffffffffce0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"BeginStep",&local_131);
    paVar4 = &local_159;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_158,
               "mode is not supported yet, only Read is valid for engine BP4Reader, in call to BeginStep"
               ,paVar4);
    helper::Throw<std::invalid_argument>
              ((string *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
               in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,iVar5);
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    std::__cxx11::string::~string((string *)(local_109 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_109);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  }
  if (((in_RDI->super_Engine).m_BetweenStepPairs & 1U) != 0) {
    in_stack_fffffffffffffcc8.__r = (rep_conflict)local_181;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_181 + 1),"Engine",(allocator *)in_stack_fffffffffffffcc8.__r);
    in_stack_fffffffffffffcc0 = (BP4Reader *)local_1a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_1a9 + 1),"BP4Reader",(allocator *)in_stack_fffffffffffffcc0);
    in_stack_fffffffffffffcb8 = (string *)local_1d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_1d1 + 1),"BeginStep",(allocator *)in_stack_fffffffffffffcb8);
    in_stack_fffffffffffffcb0 = (string *)local_1f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_1f9 + 1),
               "BeginStep() is called a second time without an intervening EndStep()",
               (allocator *)in_stack_fffffffffffffcb0);
    helper::Throw<std::logic_error>
              ((string *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
               in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,iVar5);
    std::__cxx11::string::~string((string *)(local_1f9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1f9);
    std::__cxx11::string::~string((string *)(local_1d1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1d1);
    std::__cxx11::string::~string((string *)(local_1a9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1a9);
    std::__cxx11::string::~string((string *)(local_181 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_181);
  }
  bVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0xa19099);
  if (!bVar1) {
    message = (string *)local_221;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_221 + 1),"Engine",(allocator *)message);
    paVar4 = &local_249;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_248,"BP4Reader",paVar4);
    iVar5 = (int)((ulong)paVar4 >> 0x20);
    paVar4 = &local_271;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_270,"BeginStep",paVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_298,
               "existing variables subscribed with GetDeferred, did you forget to call PerformGets() or EndStep()?, in call to BeginStep"
               ,(allocator *)&stack0xfffffffffffffd67);
    helper::Throw<std::invalid_argument>
              ((string *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
               in_stack_fffffffffffffcb0,message,iVar5);
    std::__cxx11::string::~string(local_298);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd67);
    std::__cxx11::string::~string(local_270);
    std::allocator<char>::~allocator((allocator<char> *)&local_271);
    std::__cxx11::string::~string(local_248);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
    std::__cxx11::string::~string((string *)(local_221 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_221);
  }
  ((in_RDI->super_Engine).m_IO)->m_ReadStreaming = true;
  SVar6 = OK;
  if ((in_RDI->m_FirstStep & 1U) == 0) {
    if (*(ulong *)((in_RDI->m_BP4Deserializer)._vptr_BP4Deserializer[-4] + 0x1d0 +
                  (long)&(in_RDI->m_BP4Deserializer)._vptr_BP4Deserializer) <=
        in_RDI->m_CurrentStep + 1) {
      std::chrono::duration<double,std::ratio<1l,1l>>::duration<float,void>(local_2b0,&local_10);
      SVar6 = CheckForNewSteps(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcc8);
    }
  }
  else if (*(long *)((in_RDI->m_BP4Deserializer)._vptr_BP4Deserializer[-4] + 0x1d0 +
                    (long)&(in_RDI->m_BP4Deserializer)._vptr_BP4Deserializer) == 0) {
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<float,void>(local_2a8,&local_10);
    SVar6 = CheckForNewSteps(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcc8);
  }
  if (SVar6 == OK) {
    (in_RDI->super_Engine).m_BetweenStepPairs = true;
    if ((in_RDI->m_FirstStep & 1U) == 0) {
      in_RDI->m_CurrentStep = in_RDI->m_CurrentStep + 1;
    }
    else {
      in_RDI->m_FirstStep = false;
    }
    ((in_RDI->super_Engine).m_IO)->m_EngineStep = in_RDI->m_CurrentStep;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2d0,"in call to BP4 Reader BeginStep",&local_2d1);
    IO::ResetVariablesStepSelection
              ((IO *)CONCAT44(iVar3,in_stack_fffffffffffffcf0),(bool)zeroStart,
               in_stack_fffffffffffffce0);
    std::__cxx11::string::~string(local_2d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
    IO::SetPrefixedNames
              ((IO *)CONCAT44(in_stack_fffffffffffffd64,SVar6),(bool)in_stack_fffffffffffffd5f);
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer
            ((ScopedTimer *)CONCAT44(in_stack_fffffffffffffc64,iVar2));
  return SVar6;
}

Assistant:

StepStatus BP4Reader::BeginStep(StepMode mode, const float timeoutSeconds)
{
    PERFSTUBS_SCOPED_TIMER("BP4Reader::BeginStep");
    helper::Log("Engine", "BP4Reader", "BeginStep", std::to_string(CurrentStep()), 0, m_Comm.Rank(),
                5, m_Verbosity, helper::LogMode::INFO);

    if (mode != StepMode::Read)
    {
        helper::Throw<std::invalid_argument>("Engine", "BP4Reader", "BeginStep",
                                             "mode is not supported yet, "
                                             "only Read is valid for "
                                             "engine BP4Reader, in call to "
                                             "BeginStep");
    }

    if (m_BetweenStepPairs)
    {
        helper::Throw<std::logic_error>("Engine", "BP4Reader", "BeginStep",
                                        "BeginStep() is called a second time "
                                        "without an intervening EndStep()");
    }

    if (!m_BP4Deserializer.m_DeferredVariables.empty())
    {
        helper::Throw<std::invalid_argument>("Engine", "BP4Reader", "BeginStep",
                                             "existing variables subscribed with "
                                             "GetDeferred, did you forget to call "
                                             "PerformGets() or EndStep()?, in call to BeginStep");
    }

    // used to inquire for variables in streaming mode
    m_IO.m_ReadStreaming = true;
    StepStatus status = StepStatus::OK;

    if (m_FirstStep)
    {
        if (m_BP4Deserializer.m_MetadataSet.StepsCount == 0)
        {
            status = CheckForNewSteps(Seconds(timeoutSeconds));
        }
    }
    else
    {
        if (m_CurrentStep + 1 >= m_BP4Deserializer.m_MetadataSet.StepsCount)
        {
            status = CheckForNewSteps(Seconds(timeoutSeconds));
        }
    }

    // This should be after getting new steps

    if (status == StepStatus::OK)
    {
        m_BetweenStepPairs = true;
        if (m_FirstStep)
        {
            m_FirstStep = false;
        }
        else
        {
            ++m_CurrentStep;
        }

        m_IO.m_EngineStep = m_CurrentStep;
        m_IO.ResetVariablesStepSelection(false, "in call to BP4 Reader BeginStep");

        // caches attributes for each step
        // if a variable name is a prefix
        // e.g. var  prefix = {var/v1, var/v2, var/v3}
        m_IO.SetPrefixedNames(true);
    }

    return status;
}